

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O0

void __thiscall QCheckBox::checkStateSet(QCheckBox *this)

{
  CheckState CVar1;
  QCheckBoxPrivate *pQVar2;
  CheckState state;
  QCheckBoxPrivate *d;
  undefined4 in_stack_ffffffffffffffd8;
  CheckState in_stack_ffffffffffffffdc;
  
  pQVar2 = d_func((QCheckBox *)0x52e3ac);
  (pQVar2->super_QAbstractButtonPrivate).field_0x2b4 =
       (pQVar2->super_QAbstractButtonPrivate).field_0x2b4 & 0xfd;
  CVar1 = checkState((QCheckBox *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if (CVar1 != ((byte)(pQVar2->super_QAbstractButtonPrivate).field_0x2b4 >> 3 & 7)) {
    (pQVar2->super_QAbstractButtonPrivate).field_0x2b4 =
         (pQVar2->super_QAbstractButtonPrivate).field_0x2b4 & 199 | ((byte)CVar1 & 7) << 3;
    checkStateChanged((QCheckBox *)0x52e422,in_stack_ffffffffffffffdc);
    stateChanged((QCheckBox *)0x52e430,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

void QCheckBox::checkStateSet()
{
    Q_D(QCheckBox);
    d->noChange = false;
    Qt::CheckState state = checkState();
    if (state != d->publishedState) {
        d->publishedState = state;
        emit checkStateChanged(state);
#if QT_DEPRECATED_SINCE(6, 9)
        QT_IGNORE_DEPRECATIONS(
        emit stateChanged(state);
        )
#endif
    }
}